

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O3

NaPNEvent __thiscall NaPetriNet::step_alive(NaPetriNet *this,bool bDoPrintouts)

{
  NaPNodePtrAr *pNVar1;
  FILE *pFVar2;
  NaPetriNode *pNVar3;
  NaDataFile *pNVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  NaPNEvent NVar9;
  long lVar10;
  undefined4 extraout_var;
  char *pcVar11;
  size_t sVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  NaPetriConnector *pNVar13;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  NaPNEvent NVar14;
  char *pcVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  byte bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  double dVar24;
  double dVar25;
  size_t local_40;
  int local_34;
  
  bVar20 = bDoPrintouts | this->bStepPrintout;
  if (bVar20 == 1) {
    NaPrintLog("# net \'%s\', step phases 7, 8, 9.\n",this->szName);
  }
  if (this->dfTimeChart != (NaDataFile *)0x0) {
    (*this->dfTimeChart->_vptr_NaDataFile[6])();
    iVar16 = this->iPrevIndex;
    iVar7 = (*this->pTimer->_vptr_NaTimer[5])();
    uVar23 = 0;
    if (iVar16 != iVar7) {
      uVar23 = 0x3fe999999999999a;
    }
    (*this->dfTimeChart->_vptr_NaDataFile[2])(uVar23,this->dfTimeChart,0);
  }
  if (bVar20 != 0) {
    NaPrintLog("----------------------------------------\n");
  }
  if ((FILE *)this->fpMap != (FILE *)0x0) {
    lVar10 = ftell((FILE *)this->fpMap);
    if (lVar10 == 0) {
      if (0 < (this->pnaNet).nItems) {
        iVar16 = 0;
        do {
          fwrite("==",2,1,(FILE *)this->fpMap);
          iVar16 = iVar16 + 1;
        } while (iVar16 < (this->pnaNet).nItems);
      }
      fputc(10,(FILE *)this->fpMap);
      if (0 < (this->pnaNet).nItems) {
        pNVar1 = &this->pnaNet;
        uVar19 = 0;
        local_40 = 0;
        do {
          iVar16 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar19);
          pcVar11 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var,iVar16));
          sVar12 = strlen(pcVar11);
          if ((ulong)(long)(int)local_40 < sVar12) {
            iVar16 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar19);
            pcVar11 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_00,iVar16));
            local_40 = strlen(pcVar11);
          }
          uVar17 = (int)uVar19 + 1;
          uVar19 = (ulong)uVar17;
          iVar16 = (this->pnaNet).nItems;
        } while ((int)uVar17 < iVar16);
        if (0 < (int)local_40) {
          iVar16 = 0;
          do {
            if (0 < (this->pnaNet).nItems) {
              uVar19 = 0;
              do {
                iVar7 = (*(this->pnaNet)._vptr_NaDynAr[0xf])(pNVar1,uVar19);
                pcVar11 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_01,iVar7));
                sVar12 = strlen(pcVar11);
                pFVar2 = (FILE *)this->fpMap;
                if ((int)sVar12 + iVar16 < (int)local_40) {
                  fwrite("  ",2,1,pFVar2);
                }
                else {
                  iVar7 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar19);
                  pcVar11 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_02,iVar7));
                  fprintf(pFVar2," %c",
                          (ulong)(uint)(int)pcVar11[(int)sVar12 + (iVar16 - (int)local_40)]);
                }
                uVar17 = (int)uVar19 + 1;
                uVar19 = (ulong)uVar17;
              } while ((int)uVar17 < (this->pnaNet).nItems);
            }
            fputc(10,(FILE *)this->fpMap);
            iVar16 = iVar16 + 1;
          } while (iVar16 != (int)local_40);
          iVar16 = (this->pnaNet).nItems;
        }
        if (0 < iVar16) {
          iVar16 = 0;
          do {
            fwrite("--",2,1,(FILE *)this->fpMap);
            iVar16 = iVar16 + 1;
          } while (iVar16 < (this->pnaNet).nItems);
        }
      }
      fputc(10,(FILE *)this->fpMap);
    }
  }
  bVar22 = false;
  if ((this->pnaNet).nItems < 1) {
    bVar21 = true;
  }
  else {
    pNVar1 = &this->pnaNet;
    uVar19 = 0;
    iVar16 = 0;
    local_34 = 0;
    do {
      uVar17 = (uint)uVar19;
      iVar7 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar19);
      pNVar3 = *(NaPetriNode **)CONCAT44(extraout_var_03,iVar7);
      iVar7 = NaPetriNode::connectors(pNVar3);
      if (iVar7 == 0) {
        if (bVar20 == 0) {
          iVar7 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3);
          if ((char)iVar7 != '\0') goto LAB_00145d24;
          cVar5 = '\0';
        }
        else {
LAB_00145d24:
          pcVar11 = NaPetriNode::name(pNVar3);
          cVar5 = '\0';
          NaPrintLog("node \'%s\' does not have connectors: skip it.\n",pcVar11);
        }
      }
      else {
        if (bVar20 == 0) {
          iVar7 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3);
          if ((char)iVar7 != '\0') goto LAB_00145c99;
        }
        else {
LAB_00145c99:
          pcVar11 = NaPetriNode::name(pNVar3);
          NaPrintLog("node \'%s\' try to activate.\n",pcVar11);
        }
        iVar7 = (*pNVar3->_vptr_NaPetriNode[0x11])(pNVar3);
        cVar5 = (char)iVar7;
        pNVar3->nCalls = pNVar3->nCalls + 1;
        if (bVar20 == 0) {
          iVar7 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3);
          if ((char)iVar7 == '\0') goto LAB_00145d92;
        }
        pcVar11 = NaPetriNode::name(pNVar3);
        pcVar15 = "not ";
        if (cVar5 != '\0') {
          pcVar15 = "";
        }
        NaPrintLog("node \'%s\' is %sactivated.\n",pcVar11,pcVar15);
      }
LAB_00145d92:
      pFVar2 = (FILE *)this->fpMap;
      if (pFVar2 == (FILE *)0x0) {
        if (cVar5 != '\0') goto LAB_00145dc8;
      }
      else if (cVar5 == '\0') {
        fwrite("  ",2,1,pFVar2);
      }
      else {
        fwrite(" a",2,1,pFVar2);
LAB_00145dc8:
        iVar7 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar19);
        pNVar3 = *(NaPetriNode **)CONCAT44(extraout_var_04,iVar7);
        if (bVar20 == 0) {
          iVar7 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3);
          if ((char)iVar7 != '\0') goto LAB_00145deb;
        }
        else {
LAB_00145deb:
          pcVar11 = NaPetriNode::name(pNVar3);
          NaPrintLog("node \'%s\' action.\n",pcVar11);
        }
        iVar7 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3);
        if ((char)iVar7 != '\0') {
          pcVar11 = NaPetriNode::name(pNVar3);
          NaPrintLog("node \'%s\', input data:\n",pcVar11);
          iVar7 = 0;
          while( true ) {
            iVar8 = NaPetriNode::connectors(pNVar3);
            if (iVar8 <= iVar7) break;
            pNVar13 = NaPetriNode::connector(pNVar3,iVar7);
            iVar8 = (*pNVar13->_vptr_NaPetriConnector[2])(pNVar13);
            if (0 < iVar8) {
              pNVar13 = NaPetriNode::connector(pNVar3,iVar7);
              iVar8 = (*pNVar13->_vptr_NaPetriConnector[7])(pNVar13);
              if (iVar8 == 0) {
                pNVar13 = NaPetriNode::connector(pNVar3,iVar7);
                pcVar11 = NaPetriConnector::name(pNVar13);
                NaPrintLog("  #%d \'%s\': ",(ulong)(iVar7 + 1),pcVar11);
                pNVar13 = NaPetriNode::connector(pNVar3,iVar7);
                iVar8 = (*pNVar13->_vptr_NaPetriConnector[8])(pNVar13);
                (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar8) + 0xf8))
                          ((long *)CONCAT44(extraout_var_05,iVar8));
              }
            }
            iVar7 = iVar7 + 1;
          }
        }
        (*pNVar3->_vptr_NaPetriNode[0x12])(pNVar3);
        iVar7 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3);
        if ((char)iVar7 != '\0') {
          pcVar11 = NaPetriNode::name(pNVar3);
          NaPrintLog("node \'%s\', output data:\n",pcVar11);
          iVar7 = 0;
          while( true ) {
            iVar8 = NaPetriNode::connectors(pNVar3);
            if (iVar8 <= iVar7) break;
            pNVar13 = NaPetriNode::connector(pNVar3,iVar7);
            iVar8 = (*pNVar13->_vptr_NaPetriConnector[2])(pNVar13);
            if (0 < iVar8) {
              pNVar13 = NaPetriNode::connector(pNVar3,iVar7);
              iVar8 = (*pNVar13->_vptr_NaPetriConnector[7])(pNVar13);
              if (iVar8 == 1) {
                pNVar13 = NaPetriNode::connector(pNVar3,iVar7);
                pcVar11 = NaPetriConnector::name(pNVar13);
                NaPrintLog("  #%d \'%s\': ",(ulong)(iVar7 + 1),pcVar11);
                pNVar13 = NaPetriNode::connector(pNVar3,iVar7);
                iVar8 = (*pNVar13->_vptr_NaPetriConnector[8])(pNVar13);
                (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar8) + 0xf8))
                          ((long *)CONCAT44(extraout_var_06,iVar8));
              }
            }
            iVar7 = iVar7 + 1;
          }
        }
        pNVar3->nActivations = pNVar3->nActivations + 1;
        iVar7 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar19);
        if (*(NaPetriNode **)CONCAT44(extraout_var_07,iVar7) == this->pTimingNode) {
          (*this->pTimer->_vptr_NaTimer[3])();
        }
        iVar7 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar19);
        pNVar3 = *(NaPetriNode **)CONCAT44(extraout_var_08,iVar7);
        if (bVar20 == 0) {
          iVar7 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3);
          if ((char)iVar7 != '\0') goto LAB_00145fbb;
        }
        else {
LAB_00145fbb:
          pcVar11 = NaPetriNode::name(pNVar3);
          NaPrintLog("node \'%s\' post action.\n",pcVar11);
        }
        (*pNVar3->_vptr_NaPetriNode[0x13])(pNVar3);
        local_34 = local_34 + 1;
        iVar7 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar19);
        iVar16 = iVar16 + (uint)*(byte *)(*(long *)CONCAT44(extraout_var_09,iVar7) + 0x38);
      }
      if (bVar20 == 0) {
        iVar7 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar19);
        cVar6 = (**(code **)(**(long **)CONCAT44(extraout_var_10,iVar7) + 0x18))();
        if (cVar6 != '\0') goto LAB_00146029;
      }
      else {
LAB_00146029:
        iVar7 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar19);
        (**(code **)(**(long **)CONCAT44(extraout_var_11,iVar7) + 0x38))();
      }
      pNVar4 = this->dfTimeChart;
      uVar18 = uVar17 + 1;
      uVar19 = (ulong)uVar18;
      if (pNVar4 != (NaDataFile *)0x0) {
        dVar25 = (double)(int)~uVar17;
        dVar24 = dVar25 + 0.8;
        if (cVar5 == '\0') {
          dVar24 = dVar25;
        }
        (*pNVar4->_vptr_NaDataFile[2])(dVar24,pNVar4,uVar19);
      }
    } while ((int)uVar18 < (this->pnaNet).nItems);
    bVar21 = local_34 == 0;
    bVar22 = iVar16 != 0;
  }
  if ((FILE *)this->fpMap != (FILE *)0x0) {
    fputc(10,(FILE *)this->fpMap);
  }
  NVar14 = pneHalted;
  if (!bVar22) {
    NVar14 = (bUserBreak & 1) * 3;
  }
  NVar9 = pneDead;
  if (!bVar21) {
    NVar9 = NVar14;
  }
  return NVar9;
}

Assistant:

NaPNEvent
NaPetriNet::step_alive (bool bDoPrintouts)
{
    int     iNode;
    int     nHalted = 0;
    int     iActive = 0;

    if(bStepPrintout)
      bDoPrintouts = bStepPrintout;

    if(bDoPrintouts){
        NaPrintLog("# net '%s', step phases 7, 8, 9.\n", name());
    }

    // Add point to timechart
    if(NULL != dfTimeChart){
        dfTimeChart->AppendRecord();

        // Time track
        if(iPrevIndex == timer().CurrentIndex()){
            dfTimeChart->SetValue(0.0/* old */, 0/* time */);
        }else{
            dfTimeChart->SetValue(0.8/* new */, 0/* time */);
        }
    }

    if(bDoPrintouts)
      NaPrintLog("----------------------------------------\n");

    if(NULL != fpMap){
      if(0 == ftell(fpMap)){

	/* print line */
	for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	  fprintf(fpMap, "==");
	}/* iNode */
	fputc('\n', fpMap);

	/* compute max length among names */
	int	nMaxLen = 0;

	for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	  if(strlen(pnaNet[iNode]->name()) > nMaxLen){
	    nMaxLen = strlen(pnaNet[iNode]->name());
	  }
	}/* iNode */

	int	iLine;

	/* print header */
	for(iLine = 0; iLine < nMaxLen; ++iLine){
	  for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	    int	iNameLen = strlen(pnaNet[iNode]->name());
	    if(iNameLen + iLine >= nMaxLen){
	      fprintf(fpMap, " %c",
		      pnaNet[iNode]->name()[iLine - (nMaxLen - iNameLen)]);
	    }else{
	      fprintf(fpMap, "  ");
	    }
	  }/* iNode */
	  fputc('\n', fpMap);
	}/* iLine */

	/* print line */
	for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	  fprintf(fpMap, "--");
	}/* iNode */
	fputc('\n', fpMap);

      }/* for the first time */
    }/* activation map */

    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
      bool    bActivate = false;

      try{
	NaPetriNode &node = *pnaNet[iNode];

	// 7. Do one step of node activity and return true if succeeded
	if(0 == node.connectors()) {
	    if(bDoPrintouts || node.is_verbose()){
		NaPrintLog("node '%s' does not have connectors: skip it.\n",
			   node.name());
	    }
	}
	else {
	    if(bDoPrintouts || node.is_verbose()){
		NaPrintLog("node '%s' try to activate.\n",
			   node.name());
	    }

	    bActivate = node.activate();

	    // Count calls
	    ++node.nCalls;

	    if(bDoPrintouts || node.is_verbose()){
		NaPrintLog("node '%s' is %sactivated.\n",
			   node.name(), bActivate?"" :"not ");
	    }
	}
      }catch(NaException exCode){
	NaPrintLog("Step of node activity phase (#7): node '%s' fault.\n"
		   "Caused by exception: %s\n",
		   pnaNet[iNode]->name(), NaExceptionMsg(exCode));
	bActivate = false;
      }

      /* activation map */
      if(NULL != fpMap){
	if(bActivate){
	  fprintf(fpMap, " a");
	}else{
	  fprintf(fpMap, "  ");
	}
      }/* activation map */

      if(bActivate){
	++iActive;

	try{
	  NaPetriNode &node = *pnaNet[iNode];

	  // 8. True action of the node (if activate returned true)
	  if(bDoPrintouts || node.is_verbose()){
	    NaPrintLog("node '%s' action.\n", node.name());
	  }

	  // Print contents of linked inputs
	  if(node.is_verbose()){
            int	iCn;

            NaPrintLog("node '%s', input data:\n", node.name());
            for(iCn = 0; iCn < node.connectors(); ++iCn){
	      if(node.connector(iCn)->links() > 0 &&
		 node.connector(iCn)->kind() == pckInput){
		// Only used input connectors
                NaPrintLog("  #%d '%s': ",
			   iCn + 1, node.connector(iCn)->name());
		node.connector(iCn)->data().print_contents();
	      }
            }
	  }

	  node.action();

	  // Print contents of linked outputs
	  if(node.is_verbose()){
            int	iCn;

            NaPrintLog("node '%s', output data:\n", node.name());
            for(iCn = 0; iCn < node.connectors(); ++iCn){
	      if(node.connector(iCn)->links() > 0 &&
		 node.connector(iCn)->kind() == pckOutput){
		// Only used output connectors
                NaPrintLog("  #%d '%s': ",
			   iCn + 1, node.connector(iCn)->name());
		node.connector(iCn)->data().print_contents();
	      }
            }
	  }

	  // Count activations
	  ++node.nActivations;

	  // Node is timing one - let's update timer
	  if(pnaNet[iNode] == pTimingNode)
	      timer().GoNextTime();

	}catch(NaException exCode){
	  NaPrintLog("True action phase (#8): node '%s' fault.\n"
		     "Caused by exception: %s\n",
		     pnaNet[iNode]->name(), NaExceptionMsg(exCode));
	}

	try{
	  NaPetriNode &node = *pnaNet[iNode];

	  // 9. Finish data processing by the node (if activate
	  //    returned true)
	  if(bDoPrintouts || node.is_verbose()){
	    NaPrintLog("node '%s' post action.\n",
		       node.name());
	  }
	  node.post_action();
	}catch(NaException exCode){
	  NaPrintLog("Postaction phase (#9): node '%s' fault.\n"
		     "Caused by exception: %s\n",
		     pnaNet[iNode]->name(), NaExceptionMsg(exCode));
	}

	// Check for internal halt
	if(pnaNet[iNode]->bHalt){
	  ++nHalted;
	}
      }

      try{
	if(bDoPrintouts || pnaNet[iNode]->is_verbose()){
	  pnaNet[iNode]->describe();
	}
      }catch(NaException exCode){
	// Skip...
      }

      // Add node point to time chart
      if(NULL != dfTimeChart){
	if(bActivate){
	  dfTimeChart->SetValue(-(1 + iNode) + 0.8/* active */, 1+iNode);
	}else{
	  dfTimeChart->SetValue(-(1 + iNode)/* passive */, 1+iNode);
	}
      }
    }

    /* activation map */
    if(NULL != fpMap){
      fputc('\n', fpMap);
    }

    //// Add point to timechart
    //if(NULL != dfTimeChart){
    //    dfTimeChart->AppendRecord();
    //
    //    // Time track
    //    dfTimeChart->SetValue(0.0/* old */, 0/* time */);
    //}

    if(0 == iActive){
        return pneDead;
    }else if(0 != nHalted){
        return pneHalted;
    }

#if defined(unix)
    if(bUserBreak)
      return pneTerminate;
#endif /* unix */

    return pneAlive;
}